

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnFuncType
          (BinaryReaderInterp *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  ModuleDesc *this_00;
  Result RVar1;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_a0;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_88;
  FuncType local_70;
  
  RVar1 = SharedValidator::OnFuncType
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     param_count,param_types,result_count,result_types);
  if (RVar1.enum_ != Error) {
    this_00 = this->module_;
    ToInterp((ValueTypes *)&local_88,param_count,param_types);
    ToInterp((ValueTypes *)&local_a0,result_count,result_types);
    FuncType::FuncType(&local_70,(ValueTypes *)&local_88,(ValueTypes *)&local_a0);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
    emplace_back<wabt::interp::FuncType>(&this_00->func_types,&local_70);
    FuncType::~FuncType(&local_70);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_a0);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_88);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnFuncType(Index index,
                                      Index param_count,
                                      Type* param_types,
                                      Index result_count,
                                      Type* result_types) {
  CHECK_RESULT(validator_.OnFuncType(loc, param_count, param_types,
                                     result_count, result_types));
  module_.func_types.push_back(FuncType(ToInterp(param_count, param_types),
                                        ToInterp(result_count, result_types)));
  return Result::Ok;
}